

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<_std::is_class<typename_std::decay_t<const_bool_&>_>::value,_void>
pbrt::detail::
stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
          (string *s,char *fmt,string *nextFmt,int precision,bool *v,bool *args,bool *args_1,
          bool *args_2,bool *args_3,bool *args_4,bool *args_5,bool *args_6,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_11,
          optional<pbrt::Bounds2<float>_> *args_12,optional<pbrt::Bounds2<int>_> *args_13)

{
  int iVar1;
  char *pcVar2;
  uint in_ECX;
  string *in_RDI;
  byte *in_R8;
  undefined8 in_stack_00000068;
  string str;
  size_t size;
  bool *in_stack_000001b8;
  bool *in_stack_000001c0;
  bool *in_stack_000001c8;
  bool *in_stack_000001d0;
  char *in_stack_000001d8;
  string *in_stack_000001e0;
  bool *in_stack_00000220;
  bool *in_stack_00000228;
  bool *in_stack_00000230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000258;
  optional<pbrt::Bounds2<float>_> *in_stack_00000260;
  optional<pbrt::Bounds2<int>_> *in_stack_00000268;
  undefined1 local_128 [72];
  undefined8 local_e0;
  undefined1 *local_d0;
  size_t local_b8;
  string *local_b0;
  char *local_a8;
  string *local_a0;
  string local_88 [32];
  size_t local_68;
  byte *local_58;
  uint local_4c;
  string *local_38;
  
  local_58 = in_R8;
  local_4c = in_ECX;
  local_38 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = snprintf((char *)0x0,0,pcVar2,(ulong)local_4c,(ulong)(*local_58 & 1));
  local_68 = (size_t)(iVar1 + 1);
  local_a0 = local_88;
  std::__cxx11::string::string(local_a0);
  std::__cxx11::string::resize((ulong)local_a0);
  local_a8 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
  local_b8 = local_68;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  snprintf(local_a8,local_b8,pcVar2,(ulong)local_4c,(ulong)(*local_58 & 1));
  local_b0 = local_88;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::operator+=(local_38,local_b0);
  local_e0 = in_stack_00000068;
  local_d0 = local_128;
  stringPrintfRecursive<bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&>
            (in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
             in_stack_000001c0,in_stack_000001b8,in_stack_00000220,in_stack_00000228,
             in_stack_00000230,in_stack_00000238,in_stack_00000240,in_stack_00000248,
             in_stack_00000250,in_stack_00000258,in_stack_00000260,in_stack_00000268);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

inline typename std::enable_if_t<!std::is_class<typename std::decay_t<T>>::value, void>
stringPrintfRecursiveWithPrecision(std::string *s, const char *fmt,
                                   const std::string &nextFmt, int precision, T &&v,
                                   Args &&... args) {
    size_t size = snprintf(nullptr, 0, nextFmt.c_str(), precision, v) + 1;
    std::string str;
    str.resize(size);
    snprintf(&str[0], size, nextFmt.c_str(), precision, v);
    str.pop_back();  // remove trailing NUL
    *s += str;

    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}